

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseNode(Parser *this)

{
  CodeLocation *args;
  Module *pMVar1;
  bool bVar2;
  uint32_t uVar3;
  ProcessorInstance *pPVar4;
  CodeLocation errorPos;
  string name;
  CodeLocation local_90;
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined8 local_40;
  size_type local_30;
  
  readQualifiedGeneralIdentifier_abi_cxx11_((string *)&stack0xffffffffffffffc0,this);
  pMVar1 = (this->module).object;
  if (pMVar1 != (Module *)0x0) {
    args = &(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).location;
    pPVar4 = PoolAllocator::allocate<soul::heart::ProcessorInstance,soul::CodeLocation&>
                       (&pMVar1->allocator->pool,args);
    pMVar1 = (this->module).object;
    if (pMVar1 != (Module *)0x0) {
      local_80._0_8_ = pPVar4;
      std::
      vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
      ::emplace_back<soul::pool_ref<soul::heart::ProcessorInstance>>
                ((vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
                  *)&pMVar1->processorInstances,(pool_ref<soul::heart::ProcessorInstance> *)local_80
                );
      std::__cxx11::string::_M_assign((string *)&pPVar4->instanceName);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x289d51);
      readQualifiedGeneralIdentifier_abi_cxx11_((string *)local_80,this);
      std::__cxx11::string::operator=((string *)&pPVar4->sourceName,(string *)local_80);
      if ((ProcessorInstance *)local_80._0_8_ != (ProcessorInstance *)&stack0xffffffffffffff90) {
        operator_delete((void *)local_80._0_8_,local_70 + 1);
      }
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x2b016a);
      if (bVar2) {
        uVar3 = parseProcessorArraySize(this);
        pPVar4->arraySize = uVar3;
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x285ffb);
      }
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x2aff67);
      if (bVar2) {
        local_90.sourceCode.object = (args->sourceCode).object;
        if (local_90.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_90.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_90.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_90.location.data =
             (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
        parseInt32Value((Value *)local_80,this);
        ClockMultiplier::setMultiplier<soul::CodeLocation&>
                  (&pPVar4->clockMultiplier,&local_90,(Value *)local_80);
        soul::Value::~Value((Value *)local_80);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.sourceCode.object);
      }
      else {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x289181);
        if (bVar2) {
          local_90.sourceCode.object = (args->sourceCode).object;
          if (local_90.sourceCode.object != (SourceCodeText *)0x0) {
            ((local_90.sourceCode.object)->super_RefCountedObject).refCount =
                 ((local_90.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          local_90.location.data =
               (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).location.location.data;
          parseInt32Value((Value *)local_80,this);
          ClockMultiplier::setDivider<soul::CodeLocation&>
                    (&pPVar4->clockMultiplier,&local_90,(Value *)local_80);
          soul::Value::~Value((Value *)local_80);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.sourceCode.object);
        }
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2881d4);
      if ((size_type *)local_40 != &stack0xffffffffffffffd0) {
        operator_delete((void *)local_40,local_30 + 1);
      }
      return;
    }
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseNode()
    {
        auto name = readQualifiedGeneralIdentifier();

        auto& mi = module->allocate<heart::ProcessorInstance> (location);
        module->processorInstances.push_back (mi);
        mi.instanceName = name;
        expect (HEARTOperator::assign);
        mi.sourceName = readQualifiedGeneralIdentifier();

        if (matchIf (HEARTOperator::openBracket))
        {
            mi.arraySize = parseProcessorArraySize();
            expect (HEARTOperator::closeBracket);
        }

        if (matchIf (HEARTOperator::times))
        {
            auto errorPos = location;
            mi.clockMultiplier.setMultiplier (errorPos, parseInt32Value());
        }
        else if (matchIf (HEARTOperator::divide))
        {
            auto errorPos = location;
            mi.clockMultiplier.setDivider (errorPos, parseInt32Value());
        }

        expectSemicolon();
    }